

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O2

bool __thiscall
DepsLog::RecordDeps(DepsLog *this,Node *node,TimeStamp mtime,int node_count,Node **nodes)

{
  Node **ppNVar1;
  Node **ppNVar2;
  uint uVar3;
  TimeStamp mtime_00;
  bool bVar4;
  bool bVar5;
  int i_1;
  int iVar6;
  Deps *pDVar7;
  int *piVar8;
  size_t sVar9;
  ulong uVar10;
  int i;
  ulong uVar11;
  int id;
  Node *local_50;
  uint32_t mtime_part;
  TimeStamp local_40;
  uint local_34;
  
  uVar11 = 0;
  bVar5 = false;
  local_40 = mtime;
  if (node->id_ < 0) {
    bVar4 = RecordId(this,node);
    bVar5 = true;
    if (!bVar4) {
      return false;
    }
  }
  uVar10 = 0;
  local_50 = node;
  if (0 < node_count) {
    uVar10 = (ulong)(uint)node_count;
  }
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    if (nodes[uVar11]->id_ < 0) {
      bVar4 = RecordId(this,nodes[uVar11]);
      bVar5 = true;
      if (!bVar4) {
        return false;
      }
    }
  }
  if ((((!bVar5) && (pDVar7 = GetDeps(this,local_50), pDVar7 != (Deps *)0x0)) &&
      (pDVar7->mtime == local_40)) && (pDVar7->node_count == node_count)) {
    uVar11 = 0;
    do {
      if (uVar10 == uVar11) {
        if (!bVar5) {
          return true;
        }
        break;
      }
      ppNVar1 = pDVar7->nodes + uVar11;
      ppNVar2 = nodes + uVar11;
      uVar11 = uVar11 + 1;
    } while (*ppNVar1 == *ppNVar2);
  }
  uVar3 = node_count * 4 + 0xc;
  if (uVar3 < 0x80000) {
    bVar5 = OpenForWriteIfNeeded(this);
    if (bVar5) {
      local_34 = uVar3 | 0x80000000;
      sVar9 = fwrite(&local_34,4,1,(FILE *)this->file_);
      if (sVar9 != 0) {
        id = local_50->id_;
        sVar9 = fwrite(&id,4,1,(FILE *)this->file_);
        mtime_00 = local_40;
        if (sVar9 != 0) {
          mtime_part = (uint32_t)local_40;
          sVar9 = fwrite(&mtime_part,4,1,(FILE *)this->file_);
          if (sVar9 != 0) {
            mtime_part = (uint32_t)((ulong)mtime_00 >> 0x20);
            sVar9 = fwrite(&mtime_part,4,1,(FILE *)this->file_);
            if (sVar9 != 0) {
              uVar11 = 0;
              do {
                if (uVar10 == uVar11) {
                  iVar6 = fflush((FILE *)this->file_);
                  if (iVar6 != 0) {
                    return false;
                  }
                  pDVar7 = (Deps *)operator_new(0x18);
                  Deps::Deps(pDVar7,mtime_00,node_count);
                  for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
                    pDVar7->nodes[uVar11] = nodes[uVar11];
                  }
                  UpdateDeps(this,local_50->id_,pDVar7);
                  return true;
                }
                id = nodes[uVar11]->id_;
                sVar9 = fwrite(&id,4,1,(FILE *)this->file_);
                uVar11 = uVar11 + 1;
              } while (sVar9 != 0);
            }
          }
        }
      }
    }
  }
  else {
    piVar8 = __errno_location();
    *piVar8 = 0x22;
  }
  return false;
}

Assistant:

bool DepsLog::RecordDeps(Node* node, TimeStamp mtime,
                         int node_count, Node** nodes) {
  // Track whether there's any new data to be recorded.
  bool made_change = false;

  // Assign ids to all nodes that are missing one.
  if (node->id() < 0) {
    if (!RecordId(node))
      return false;
    made_change = true;
  }
  for (int i = 0; i < node_count; ++i) {
    if (nodes[i]->id() < 0) {
      if (!RecordId(nodes[i]))
        return false;
      made_change = true;
    }
  }

  // See if the new data is different than the existing data, if any.
  if (!made_change) {
    Deps* deps = GetDeps(node);
    if (!deps ||
        deps->mtime != mtime ||
        deps->node_count != node_count) {
      made_change = true;
    } else {
      for (int i = 0; i < node_count; ++i) {
        if (deps->nodes[i] != nodes[i]) {
          made_change = true;
          break;
        }
      }
    }
  }

  // Don't write anything if there's no new info.
  if (!made_change)
    return true;

  // Update on-disk representation.
  unsigned size = 4 * (1 + 2 + node_count);
  if (size > kMaxRecordSize) {
    errno = ERANGE;
    return false;
  }

  if (!OpenForWriteIfNeeded()) {
    return false;
  }
  size |= 0x80000000;  // Deps record: set high bit.
  if (fwrite(&size, 4, 1, file_) < 1)
    return false;
  int id = node->id();
  if (fwrite(&id, 4, 1, file_) < 1)
    return false;
  uint32_t mtime_part = static_cast<uint32_t>(mtime & 0xffffffff);
  if (fwrite(&mtime_part, 4, 1, file_) < 1)
    return false;
  mtime_part = static_cast<uint32_t>((mtime >> 32) & 0xffffffff);
  if (fwrite(&mtime_part, 4, 1, file_) < 1)
    return false;
  for (int i = 0; i < node_count; ++i) {
    id = nodes[i]->id();
    if (fwrite(&id, 4, 1, file_) < 1)
      return false;
  }
  if (fflush(file_) != 0)
    return false;

  // Update in-memory representation.
  Deps* deps = new Deps(mtime, node_count);
  for (int i = 0; i < node_count; ++i)
    deps->nodes[i] = nodes[i];
  UpdateDeps(node->id(), deps);

  return true;
}